

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O1

void cppcms::impl::string_map::insert
               (vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                *d,entry *e,int *first)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  long lVar7;
  pointer peVar8;
  ulong uVar9;
  long lVar10;
  
  peVar8 = (d->
           super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)(d->
                 super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)peVar8 >> 3) *
          -0x5555555555555555;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar9;
  auVar2 = ZEXT416(e->hash) % auVar2;
  lVar7 = auVar2._0_8_;
  iVar6 = auVar2._0_4_;
  lVar10 = (long)iVar6;
  pcVar1 = peVar8[lVar10].key;
  while (pcVar1 != (char *)0x0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar9;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (lVar7 << 0x20) + 0x100000000 >> 0x20;
    lVar7 = SUB168(auVar4 % auVar3,0);
    iVar6 = SUB164(auVar4 % auVar3,0);
    lVar10 = (long)iVar6;
    pcVar1 = peVar8[lVar10].key;
  }
  peVar8 = peVar8 + lVar10;
  iVar5 = e->next_index;
  peVar8->hash = e->hash;
  peVar8->next_index = iVar5;
  pcVar1 = e->value;
  peVar8->key = e->key;
  peVar8->value = pcVar1;
  (d->
  super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  )._M_impl.super__Vector_impl_data._M_start[lVar10].next_index = *first;
  *first = iVar6;
  return;
}

Assistant:

static void insert(std::vector<entry> &d,entry const &e,int &first)
			{
				int pos = e.hash % d.size();
				while(d[pos].key)
					pos = (pos + 1) % d.size();
				d[pos] = e;
				d[pos].next_index = first;
				first = pos;
			}